

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_avx2.c
# Opt level: O2

void av1_highbd_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  __m256i qp [3];
  __m256i local_160;
  longlong local_140;
  longlong lStack_138;
  longlong lStack_130;
  longlong lStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  __m256i local_e0;
  __m256i local_c0;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  auVar1 = *(undefined1 (*) [16])round_ptr;
  if (log_scale != 0) {
    auVar4._0_2_ = (undefined2)(1 << (0xfU - (char)log_scale & 0x1f));
    auVar4._2_2_ = auVar4._0_2_;
    auVar4._4_2_ = auVar4._0_2_;
    auVar4._6_2_ = auVar4._0_2_;
    auVar4._8_2_ = auVar4._0_2_;
    auVar4._10_2_ = auVar4._0_2_;
    auVar4._12_2_ = auVar4._0_2_;
    auVar4._14_2_ = auVar4._0_2_;
    auVar1 = vpmulhrsw_avx(auVar1,auVar4);
  }
  auVar4 = vpmovzxwd_avx(auVar1);
  auVar1 = vpunpckhwd_avx(auVar1,(undefined1  [16])0x0);
  local_e0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar4;
  local_e0._16_16_ = ZEXT116(1) * auVar1;
  auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])quant_ptr);
  auVar4 = vpunpckhwd_avx(*(undefined1 (*) [16])quant_ptr,(undefined1  [16])0x0);
  local_100._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar1;
  local_100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  auVar1 = vpmovzxwd_avx(*(undefined1 (*) [16])dequant_ptr);
  auVar4 = vpunpckhwd_avx(*(undefined1 (*) [16])dequant_ptr,(undefined1  [16])0x0);
  local_120._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar1;
  local_120._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  local_140 = *(longlong *)coeff_ptr;
  lStack_138 = *(longlong *)(coeff_ptr + 2);
  lStack_130 = *(longlong *)(coeff_ptr + 4);
  lStack_128 = *(longlong *)(coeff_ptr + 6);
  local_160 = (__m256i)(ZEXT832(0) << 0x20);
  local_c0 = local_e0;
  local_a0 = local_100;
  local_80 = local_120;
  quantize(&local_c0,(__m256i *)&local_140,iscan,log_scale,qcoeff_ptr,dqcoeff_ptr,&local_160);
  local_c0 = (__m256i)vpermpd_avx2((undefined1  [32])local_e0,0xee);
  local_a0 = vpermpd_avx2(local_100,0xee);
  local_80 = vpermpd_avx2(local_120,0xee);
  while( true ) {
    iscan = iscan + 8;
    dqcoeff_ptr = dqcoeff_ptr + 8;
    qcoeff_ptr = qcoeff_ptr + 8;
    if (n_coeffs < 9) break;
    n_coeffs = n_coeffs + -8;
    local_140 = *(longlong *)((long)coeff_ptr + 0x20);
    lStack_138 = *(longlong *)((long)coeff_ptr + 0x28);
    lStack_130 = *(longlong *)((long)coeff_ptr + 0x30);
    lStack_128 = *(longlong *)((long)coeff_ptr + 0x38);
    quantize(&local_c0,(__m256i *)&local_140,iscan,log_scale,qcoeff_ptr,dqcoeff_ptr,&local_160);
    coeff_ptr = (tran_low_t *)((long)coeff_ptr + 0x20);
  }
  auVar2 = vpshufd_avx2((undefined1  [32])local_160,0xe);
  auVar2 = vpmaxsw_avx2((undefined1  [32])local_160,auVar2);
  auVar3 = vpshuflw_avx2(auVar2,0xe);
  auVar2 = vpmaxsw_avx2(auVar2,auVar3);
  auVar3 = vpshuflw_avx2(auVar2,1);
  auVar2 = vpmaxsw_avx2(auVar2,auVar3);
  auVar1 = vpmaxsw_avx(auVar2._0_16_,auVar2._16_16_);
  vpextrw_avx(auVar1,0);
  return;
}

Assistant:

void av1_highbd_quantize_fp_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  (void)scan;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  const unsigned int step = 8;
  __m256i qp[3], coeff;

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, qp);
  coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);

  __m256i eob = _mm256_setzero_si256();
  quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);
  while (n_coeffs > 0) {
    coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);
    quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }
  {
    __m256i eob_s;
    eob_s = _mm256_shuffle_epi32(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 1);
    eob = _mm256_max_epi16(eob, eob_s);
    const __m128i final_eob = _mm_max_epi16(_mm256_castsi256_si128(eob),
                                            _mm256_extractf128_si256(eob, 1));
    *eob_ptr = _mm_extract_epi16(final_eob, 0);
  }
}